

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

ssize_t __thiscall
kj::AsyncInputStream::read(AsyncInputStream *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  PropagateException local_39;
  Promise<unsigned_long> local_38;
  size_t local_28;
  size_t bytes_local;
  void *buffer_local;
  AsyncInputStream *this_local;
  
  buffer_local = (void *)CONCAT44(in_register_00000034,__fd);
  local_28 = __nbytes;
  bytes_local = (size_t)__buf;
  this_local = this;
  (*(code *)**buffer_local)((Type *)&local_38,buffer_local,__buf,__nbytes);
  Promise<unsigned_long>::
  then<kj::AsyncInputStream::read(void*,unsigned_long)::__0,kj::_::PropagateException>
            ((Promise<unsigned_long> *)this,(Type *)&local_38,&local_39);
  Promise<unsigned_long>::~Promise(&local_38);
  return (ssize_t)this;
}

Assistant:

Promise<void> AsyncInputStream::read(void* buffer, size_t bytes) {
  return read(buffer, bytes, bytes).then([](size_t) {});
}